

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_string.c
# Opt level: O0

void archive_mstring_clean(archive_mstring *aes)

{
  long in_RDI;
  
  archive_wstring_free((archive_wstring *)0x159732);
  archive_string_free((archive_string *)0x15973b);
  archive_string_free((archive_string *)0x159748);
  archive_string_free((archive_string *)0x159755);
  *(undefined4 *)(in_RDI + 0x60) = 0;
  return;
}

Assistant:

void
archive_mstring_clean(struct archive_mstring *aes)
{
	archive_wstring_free(&(aes->aes_wcs));
	archive_string_free(&(aes->aes_mbs));
	archive_string_free(&(aes->aes_utf8));
	archive_string_free(&(aes->aes_mbs_in_locale));
	aes->aes_set = 0;
}